

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ParameterValueAssignmentSyntax::setChild
          (ParameterValueAssignmentSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00c92444 + *(int *)(&DAT_00c92444 + in_RSI * 4)))();
  return;
}

Assistant:

void ParameterValueAssignmentSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: hash = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: parameters = child.node()->as<SeparatedSyntaxList<ParamAssignmentSyntax>>(); return;
        case 3: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}